

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void L3_intensity_stereo(float *left,uint8_t *ist_pos,L3_gr_info_t *gr,uint8_t *hdr)

{
  undefined1 uVar1;
  int nbands;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  float *in_RSI;
  long in_RDI;
  int prev;
  int itop;
  int default_pos;
  int max_blocks;
  int i;
  int n_sfb;
  int max_band [3];
  int local_48;
  int mpeg2_sh;
  int in_stack_ffffffffffffffd4;
  int iVar5;
  int in_stack_ffffffffffffffd8;
  int iVar6;
  int in_stack_ffffffffffffffdc;
  
  nbands = (uint)in_RDX[0x11] + (uint)in_RDX[0x12];
  iVar2 = 1;
  if (in_RDX[0x12] != '\0') {
    iVar2 = 3;
  }
  L3_stereo_top_band((float *)(in_RDI + 0x900),*(uint8_t **)in_RDX,nbands,
                     (int *)&stack0xffffffffffffffd4);
  iVar5 = in_stack_ffffffffffffffd4;
  iVar6 = in_stack_ffffffffffffffd8;
  if (in_RDX[0x11] != '\0') {
    local_48 = in_stack_ffffffffffffffd4;
    if (in_stack_ffffffffffffffd4 < in_stack_ffffffffffffffd8) {
      local_48 = in_stack_ffffffffffffffd8;
    }
    iVar5 = in_stack_ffffffffffffffdc;
    iVar6 = in_stack_ffffffffffffffdc;
    if ((in_stack_ffffffffffffffdc <= local_48) &&
       (iVar5 = in_stack_ffffffffffffffd4, iVar6 = in_stack_ffffffffffffffd4,
       in_stack_ffffffffffffffdc = in_stack_ffffffffffffffd4,
       in_stack_ffffffffffffffd4 < in_stack_ffffffffffffffd8)) {
      iVar5 = in_stack_ffffffffffffffd8;
      iVar6 = in_stack_ffffffffffffffd8;
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffd8;
    }
  }
  for (mpeg2_sh = 0; mpeg2_sh < iVar2; mpeg2_sh = mpeg2_sh + 1) {
    uVar1 = 0;
    if ((in_RCX[1] & 8) != 0) {
      uVar1 = 3;
    }
    iVar3 = (nbands - iVar2) + mpeg2_sh;
    iVar4 = iVar3 - iVar2;
    if (*(int *)(&stack0xffffffffffffffd4 + (long)mpeg2_sh * 4) < iVar4) {
      uVar1 = *(undefined1 *)((long)in_RSI + (long)iVar4);
    }
    *(undefined1 *)((long)in_RSI + (long)iVar3) = uVar1;
  }
  L3_stereo_process(in_RSI,in_RDX,in_RCX,(uint8_t *)CONCAT44(in_stack_ffffffffffffffdc,iVar6),
                    (int *)CONCAT44(iVar5,nbands),mpeg2_sh);
  return;
}

Assistant:

static void L3_intensity_stereo(float *left, uint8_t *ist_pos, const L3_gr_info_t *gr, const uint8_t *hdr)
{
    int max_band[3], n_sfb = gr->n_long_sfb + gr->n_short_sfb;
    int i, max_blocks = gr->n_short_sfb ? 3 : 1;

    L3_stereo_top_band(left + 576, gr->sfbtab, n_sfb, max_band);
    if (gr->n_long_sfb)
    {
        max_band[0] = max_band[1] = max_band[2] = MINIMP3_MAX(MINIMP3_MAX(max_band[0], max_band[1]), max_band[2]);
    }
    for (i = 0; i < max_blocks; i++)
    {
        int default_pos = HDR_TEST_MPEG1(hdr) ? 3 : 0;
        int itop = n_sfb - max_blocks + i;
        int prev = itop - max_blocks;
        ist_pos[itop] = max_band[i] >= prev ? default_pos : ist_pos[prev];
    }
    L3_stereo_process(left, ist_pos, gr->sfbtab, hdr, max_band, gr[1].scalefac_compress & 1);
}